

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O2

void __thiscall dynamicgraph::TracerRealTime::TracerRealTime(TracerRealTime *this,string *n)

{
  string doc;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(string *)n);
  dynamicgraph::Tracer::Tracer(&this->super_Tracer,local_38);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)this = &PTR__TracerRealTime_001155b0;
  this->bufferSize = 0x100000;
  (this->hardFiles).
  super__List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->hardFiles;
  (this->hardFiles).
  super__List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->hardFiles;
  (this->hardFiles).
  super__List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Trash the current content of the buffers, without saving it.",
             (allocator<char> *)&local_b8);
  command::docCommandVoid0(&local_58,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"empty",(allocator<char> *)&local_b8);
  command::makeCommandVoid0<dynamicgraph::TracerRealTime>
            ((command *)this,(TracerRealTime *)emptyBuffers,0,&local_58);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"getBufferSize",&local_d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"bufferSize",&local_da);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"int",&local_db);
  command::docDirectGetter(&local_b8,&local_78,&local_98);
  command::makeDirectGetter<dynamicgraph::TracerRealTime,int>(this,&this->bufferSize,&local_b8);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"setBufferSize",&local_d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"bufferSize",&local_da);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"int",&local_db);
  command::docDirectSetter(&local_b8,&local_78,&local_98);
  command::makeDirectSetter<dynamicgraph::TracerRealTime,int>(this,&this->bufferSize,&local_b8);
  dynamicgraph::Entity::addCommand((string *)this,(Command *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

TracerRealTime::TracerRealTime(const std::string &n)
    : Tracer(n), bufferSize(BUFFER_SIZE_DEFAULT) {
  dgDEBUGINOUT(15);

  /* --- Commands --- */
  {
    using namespace dynamicgraph::command;
    std::string doc = docCommandVoid0(
        "Trash the current content of the buffers, without saving it.");
    addCommand("empty",
               makeCommandVoid0(*this, &TracerRealTime::emptyBuffers, doc));

    addCommand("getBufferSize",
               makeDirectGetter(*this, &bufferSize,
                                docDirectGetter("bufferSize", "int")));
    addCommand("setBufferSize",
               makeDirectSetter(*this, &bufferSize,
                                docDirectSetter("bufferSize", "int")));
  }  // using namespace command

  dgDEBUGOUT(15);
}